

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_new(runtime_type *this,var *b)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  type_t *ptVar3;
  runtime_error *this_00;
  any *in_RDX;
  string local_38;
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != "N2cs6type_tE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N2cs6type_tE");
      if (iVar1 == 0) goto LAB_00163266;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(New).","");
    runtime_error::runtime_error(this_00,&local_38);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_00163266:
  ptVar3 = cs_impl::any::const_val<cs::type_t>(in_RDX);
  if ((ptVar3->constructor).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(ptVar3->constructor)._M_invoker)((_Any_data *)this);
    return (var)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

var runtime_type::parse_new(const var &b)
	{
		if (b.type() == typeid(type_t))
			return b.const_val<type_t>().constructor();
		else
			throw runtime_error("Unsupported operator operations(New).");
	}